

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(ItemSimilarityRecommender *a,ItemSimilarityRecommender *b)

{
  invalid_argument *anon_var_0;
  _ItemSimilarityRecommenderData local_178;
  ItemSimilarityRecommender *local_20;
  ItemSimilarityRecommender *b_local;
  ItemSimilarityRecommender *a_local;
  
  local_20 = b;
  b_local = a;
  Recommender::_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData(&local_178,a);
  Recommender::_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData
            ((_ItemSimilarityRecommenderData *)&anon_var_0,local_20);
  a_local._7_1_ =
       Recommender::_ItemSimilarityRecommenderData::operator==
                 (&local_178,(_ItemSimilarityRecommenderData *)&anon_var_0);
  Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData
            ((_ItemSimilarityRecommenderData *)&anon_var_0);
  Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData(&local_178);
  return (bool)(a_local._7_1_ & 1);
}

Assistant:

bool operator==(const ItemSimilarityRecommender& a,
                        const ItemSimilarityRecommender& b) {
            try {
               return (Recommender::_ItemSimilarityRecommenderData(a)
                       == Recommender::_ItemSimilarityRecommenderData(b));
            } catch(const std::invalid_argument&) {
                return false;
            }
        }